

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_bind(void *arg,nng_url *url)

{
  uint32_t uVar1;
  undefined1 local_b8 [8];
  nng_sockaddr sa;
  udp_ep *puStack_28;
  int rv;
  udp_ep *ep;
  nng_url *url_local;
  void *arg_local;
  
  puStack_28 = (udp_ep *)arg;
  ep = (udp_ep *)url;
  url_local = (nng_url *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if ((puStack_28->started & 1U) == 0) {
    sa.s_storage.sa_pad[0xf]._4_4_ = nni_plat_udp_open(&puStack_28->udp,&puStack_28->self_sa);
    if (sa.s_storage.sa_pad[0xf]._4_4_ == 0) {
      nni_plat_udp_sockname(puStack_28->udp,(nni_sockaddr *)local_b8);
      uVar1 = nng_sockaddr_port((nng_sockaddr *)local_b8);
      (ep->mtx).mtx.__data.__kind = uVar1;
      udp_ep_start(puStack_28);
      nni_mtx_unlock(&puStack_28->mtx);
      arg_local._4_4_ = sa.s_storage.sa_pad[0xf]._4_4_;
    }
    else {
      nni_mtx_unlock(&puStack_28->mtx);
      arg_local._4_4_ = sa.s_storage.sa_pad[0xf]._4_4_;
    }
  }
  else {
    nni_mtx_unlock(&puStack_28->mtx);
    arg_local._4_4_ = 4;
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_ep_bind(void *arg, nng_url *url)
{
	udp_ep *ep = arg;
	int     rv;

	nni_mtx_lock(&ep->mtx);
	if (ep->started) {
		nni_mtx_unlock(&ep->mtx);
		return (NNG_EBUSY);
	}

	rv = nni_udp_open(&ep->udp, &ep->self_sa);
	if (rv != 0) {
		nni_mtx_unlock(&ep->mtx);
		return (rv);
	}
	nng_sockaddr sa;
	nni_plat_udp_sockname(ep->udp, &sa);
	url->u_port = nng_sockaddr_port(&sa);
	udp_ep_start(ep);
	nni_mtx_unlock(&ep->mtx);

	return (rv);
}